

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  U32 UVar2;
  uint uVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  U32 UVar13;
  U32 UVar14;
  U32 UVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  U64 UVar22;
  U64 UVar23;
  BYTE *pBVar24;
  ulong uVar25;
  bool bVar26;
  uint local_17e8;
  uint local_17e4;
  uint local_167c;
  uint local_1678;
  uint local_1674;
  uint local_150c;
  uint local_1508;
  uint local_1504;
  uint local_139c;
  uint local_1398;
  uint local_1394;
  uint local_122c;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 tmpOffset_3;
  size_t repLength2_3;
  BYTE *repEnd2_3;
  BYTE *repMatch2_3;
  U32 repIndex2_3;
  U32 current2_3;
  U32 indexToInsert_3;
  BYTE *dictMatchL3_3;
  BYTE *pBStack_1198;
  U32 dictMatchIndexL3_3;
  BYTE *matchL3_3;
  U32 matchIndexL3_3;
  size_t dictHLNext_3;
  size_t hl3_3;
  U32 dictMatchIndexS_3;
  BYTE *dictMatchL_3;
  U32 dictMatchIndexL_3;
  BYTE *repMatchEnd_3;
  BYTE *repMatch_3;
  BYTE *pBStack_1148;
  U32 repIndex_3;
  BYTE *match_3;
  BYTE *matchLong_3;
  U32 matchIndexS_3;
  U32 matchIndexL_3;
  U32 current_3;
  size_t dictHS_3;
  size_t dictHL_3;
  size_t h_3;
  size_t h2_3;
  long lStack_1100;
  U32 offset_5;
  size_t mLength_3;
  U32 maxRep_3;
  U32 dictAndPrefixLength_3;
  U32 dictHBitsS_3;
  U32 dictHBitsL_3;
  U32 dictIndexDelta_3;
  BYTE *dictEnd_3;
  BYTE *dictStart_3;
  BYTE *dictBase_3;
  U32 dictStartIndex_3;
  U32 *dictHashSmall_3;
  U32 *dictHashLong_3;
  ZSTD_compressionParameters *dictCParams_3;
  ZSTD_matchState_t *dms_3;
  uint local_1098;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixLowest_3;
  U32 prefixLowestIndex_3;
  U32 maxDistance_3;
  U32 lowestValid_3;
  U32 endIndex_3;
  BYTE *anchor_3;
  BYTE *ip_18;
  BYTE *istart_3;
  BYTE *base_3;
  U32 hBitsS_3;
  U32 *hashSmall_3;
  U32 hBitsL_3;
  U32 *hashLong_3;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 tmpOffset_2;
  size_t repLength2_2;
  BYTE *repEnd2_2;
  BYTE *repMatch2_2;
  U32 repIndex2_2;
  U32 current2_2;
  U32 indexToInsert_2;
  BYTE *dictMatchL3_2;
  BYTE *pBStack_fa0;
  U32 dictMatchIndexL3_2;
  BYTE *matchL3_2;
  U32 matchIndexL3_2;
  size_t dictHLNext_2;
  size_t hl3_2;
  U32 dictMatchIndexS_2;
  BYTE *dictMatchL_2;
  U32 dictMatchIndexL_2;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  BYTE *pBStack_f50;
  U32 repIndex_2;
  BYTE *match_2;
  BYTE *matchLong_2;
  U32 matchIndexS_2;
  U32 matchIndexL_2;
  U32 current_2;
  size_t dictHS_2;
  size_t dictHL_2;
  size_t h_2;
  size_t h2_2;
  long lStack_f08;
  U32 offset_4;
  size_t mLength_2;
  U32 maxRep_2;
  U32 dictAndPrefixLength_2;
  U32 dictHBitsS_2;
  U32 dictHBitsL_2;
  U32 dictIndexDelta_2;
  BYTE *dictEnd_2;
  BYTE *dictStart_2;
  BYTE *dictBase_2;
  U32 dictStartIndex_2;
  U32 *dictHashSmall_2;
  U32 *dictHashLong_2;
  ZSTD_compressionParameters *dictCParams_2;
  ZSTD_matchState_t *dms_2;
  uint local_ea0;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixLowest_2;
  U32 prefixLowestIndex_2;
  U32 maxDistance_2;
  U32 lowestValid_2;
  U32 endIndex_2;
  BYTE *anchor_2;
  BYTE *ip_12;
  BYTE *istart_2;
  BYTE *base_2;
  U32 hBitsS_2;
  U32 *hashSmall_2;
  U32 hBitsL_2;
  U32 *hashLong_2;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 tmpOffset_1;
  size_t repLength2_1;
  BYTE *repEnd2_1;
  BYTE *repMatch2_1;
  U32 repIndex2_1;
  U32 current2_1;
  U32 indexToInsert_1;
  BYTE *dictMatchL3_1;
  BYTE *pBStack_da8;
  U32 dictMatchIndexL3_1;
  BYTE *matchL3_1;
  U32 matchIndexL3_1;
  size_t dictHLNext_1;
  size_t hl3_1;
  U32 dictMatchIndexS_1;
  BYTE *dictMatchL_1;
  U32 dictMatchIndexL_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  BYTE *pBStack_d58;
  U32 repIndex_1;
  BYTE *match_1;
  BYTE *matchLong_1;
  U32 matchIndexS_1;
  U32 matchIndexL_1;
  U32 current_1;
  size_t dictHS_1;
  size_t dictHL_1;
  size_t h_1;
  size_t h2_1;
  long lStack_d10;
  U32 offset_3;
  size_t mLength_1;
  U32 maxRep_1;
  U32 dictAndPrefixLength_1;
  U32 dictHBitsS_1;
  U32 dictHBitsL_1;
  U32 dictIndexDelta_1;
  BYTE *dictEnd_1;
  BYTE *dictStart_1;
  BYTE *dictBase_1;
  U32 dictStartIndex_1;
  U32 *dictHashSmall_1;
  U32 *dictHashLong_1;
  ZSTD_compressionParameters *dictCParams_1;
  ZSTD_matchState_t *dms_1;
  uint local_ca8;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixLowest_1;
  U32 prefixLowestIndex_1;
  U32 maxDistance_1;
  U32 lowestValid_1;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip_6;
  BYTE *istart_1;
  BYTE *base_1;
  U32 hBitsS_1;
  U32 *hashSmall_1;
  U32 hBitsL_1;
  U32 *hashLong_1;
  ZSTD_compressionParameters *cParams_1;
  U32 tmpOff;
  size_t rLength;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *dictMatchL3;
  BYTE *pBStack_bb0;
  U32 dictMatchIndexL3;
  BYTE *matchL3;
  U32 matchIndexL3;
  size_t dictHLNext;
  size_t hl3;
  U32 dictMatchIndexS;
  BYTE *dictMatchL;
  U32 dictMatchIndexL;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_b60;
  U32 repIndex;
  BYTE *match;
  BYTE *matchLong;
  U32 matchIndexS;
  U32 matchIndexL;
  U32 current;
  size_t dictHS;
  size_t dictHL;
  size_t h;
  size_t h2;
  long lStack_b18;
  U32 offset;
  size_t mLength;
  U32 maxRep;
  U32 dictAndPrefixLength;
  U32 dictHBitsS;
  U32 dictHBitsL;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashSmall;
  U32 *dictHashLong;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  uint local_ab0;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  U32 maxDistance;
  U32 lowestValid;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *litEnd_8;
  BYTE *litLimit_w_8;
  BYTE *litEnd_9;
  BYTE *litLimit_w_9;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_10;
  BYTE *litLimit_w_10;
  BYTE *litEnd_11;
  BYTE *litLimit_w_11;
  BYTE *litEnd_13;
  BYTE *litLimit_w_13;
  BYTE *litEnd_14;
  BYTE *litLimit_w_14;
  BYTE *litEnd_12;
  BYTE *litLimit_w_12;
  BYTE *litEnd_15;
  BYTE *litLimit_w_15;
  BYTE *litEnd_16;
  BYTE *litLimit_w_16;
  BYTE *litEnd_18;
  BYTE *litLimit_w_18;
  BYTE *litEnd_19;
  BYTE *litLimit_w_19;
  BYTE *litEnd_17;
  BYTE *litLimit_w_17;
  BYTE *oend_17;
  BYTE *op_17;
  BYTE *ip_21;
  ptrdiff_t diff_17;
  BYTE *oend_19;
  BYTE *op_19;
  BYTE *ip_23;
  ptrdiff_t diff_19;
  BYTE *oend_18;
  BYTE *op_18;
  BYTE *ip_22;
  ptrdiff_t diff_18;
  BYTE *oend_16;
  BYTE *op_16;
  BYTE *ip_20;
  ptrdiff_t diff_16;
  BYTE *oend_15;
  BYTE *op_15;
  BYTE *ip_19;
  ptrdiff_t diff_15;
  BYTE *oend_12;
  BYTE *op_12;
  BYTE *ip_15;
  ptrdiff_t diff_12;
  BYTE *oend_14;
  BYTE *op_14;
  BYTE *ip_17;
  ptrdiff_t diff_14;
  BYTE *oend_13;
  BYTE *op_13;
  BYTE *ip_16;
  ptrdiff_t diff_13;
  BYTE *oend_11;
  BYTE *op_11;
  BYTE *ip_14;
  ptrdiff_t diff_11;
  BYTE *oend_10;
  BYTE *op_10;
  BYTE *ip_13;
  ptrdiff_t diff_10;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_9;
  ptrdiff_t diff_7;
  BYTE *oend_9;
  BYTE *op_9;
  BYTE *ip_11;
  ptrdiff_t diff_9;
  BYTE *oend_8;
  BYTE *op_8;
  BYTE *ip_10;
  ptrdiff_t diff_8;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_8;
  ptrdiff_t diff_6;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_7;
  ptrdiff_t diff_5;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_5;
  ptrdiff_t diff_4;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  iVar10 = (int)srcSize;
  iVar8 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar9 = (int)pBVar6;
    iVar10 = (iVar8 - iVar9) + iVar10;
    local_122c = (ms->window).dictLimit;
    uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    if (uVar11 < iVar10 - local_122c) {
      local_122c = iVar10 - uVar11;
    }
    pBVar16 = pBVar6 + local_122c;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar11 = *rep;
    uVar3 = rep[1];
    dms._4_4_ = 0;
    anchor = (BYTE *)((long)src + (long)(int)(uint)(iVar8 == (int)pBVar16));
    uVar12 = (int)anchor - (int)pBVar16;
    local_ab0 = uVar3;
    if (uVar12 < uVar3) {
      local_ab0 = 0;
      dms._4_4_ = uVar3;
    }
    offsetSaved = uVar11;
    _lowestValid = (BYTE *)src;
    if (uVar12 < uVar11) {
      offsetSaved = 0;
      dms._4_4_ = uVar11;
    }
    while (anchor < pBVar18) {
      sVar19 = ZSTD_hashPtr(anchor,UVar1,8);
      sVar20 = ZSTD_hashPtr(anchor,UVar2,4);
      ZSTD_hashPtr(anchor,UVar1,8);
      ZSTD_hashPtr(anchor,UVar2,4);
      iVar10 = (int)anchor;
      UVar13 = iVar10 - iVar9;
      uVar11 = pUVar4[sVar19];
      uVar3 = pUVar5[sVar20];
      match = pBVar6 + uVar11;
      pBStack_b60 = pBVar6 + uVar3;
      pUVar5[sVar20] = UVar13;
      pUVar4[sVar19] = UVar13;
      UVar15 = MEM_read32(anchor + (1 - (ulong)offsetSaved));
      UVar14 = MEM_read32(anchor + 1);
      if (offsetSaved == 0 || UVar15 != UVar14) {
        if (local_122c < uVar11) {
          UVar22 = MEM_read64(match);
          UVar23 = MEM_read64(anchor);
          if (UVar22 != UVar23) goto LAB_0012536c;
          sVar19 = ZSTD_count(anchor + 8,match + 8,pBVar17);
          lStack_b18 = sVar19 + 8;
          h2._4_4_ = iVar10 - (int)match;
          while( true ) {
            bVar26 = false;
            if (_lowestValid < anchor && pBVar16 < match) {
              bVar26 = anchor[-1] == match[-1];
            }
            if (!bVar26) break;
            anchor = anchor + -1;
            match = match + -1;
            lStack_b18 = lStack_b18 + 1;
          }
LAB_00125a06:
          local_ab0 = offsetSaved;
          offsetSaved = h2._4_4_;
          uVar25 = (long)anchor - (long)_lowestValid;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < _lowestValid + uVar25) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < _lowestValid + uVar25) {
            ZSTD_safecopyLiterals(seqStore->lit,_lowestValid,_lowestValid + uVar25,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_lowestValid);
            if (0x10 < uVar25) {
              pBVar7 = seqStore->lit;
              pBVar24 = pBVar7 + 0x10;
              lVar21 = (long)pBVar24 - (long)(_lowestValid + 0x10);
              if (lVar21 < 8 && -0x10 < lVar21) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (lVar21 < 0x10 && -0x10 < lVar21) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar24,_lowestValid + 0x10);
              while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
                op_2 = _lowestValid + 0x20;
                ZSTD_copy16(pBVar7,op_2);
                ZSTD_copy16(pBVar7 + 0x10,_lowestValid + 0x30);
                _lowestValid = op_2;
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar25;
          seqStore->sequences->offset = h2._4_4_ + 3;
          if (0xffff < lStack_b18 - 3U) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_b18 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_00125fd7;
        }
LAB_0012536c:
        if (local_122c < uVar3) {
          UVar15 = MEM_read32(pBStack_b60);
          UVar14 = MEM_read32(anchor);
          if (UVar15 == UVar14) {
            sVar19 = ZSTD_hashPtr(anchor + 1,UVar1,8);
            ZSTD_hashPtr(anchor + 1,UVar1,8);
            uVar11 = pUVar4[sVar19];
            pBStack_bb0 = pBVar6 + uVar11;
            pUVar4[sVar19] = UVar13 + 1;
            if (local_122c < uVar11) {
              UVar22 = MEM_read64(pBStack_bb0);
              UVar23 = MEM_read64(anchor + 1);
              if (UVar22 == UVar23) {
                sVar19 = ZSTD_count(anchor + 9,pBStack_bb0 + 8,pBVar17);
                lStack_b18 = sVar19 + 8;
                anchor = anchor + 1;
                h2._4_4_ = (int)anchor - (int)pBStack_bb0;
                while( true ) {
                  bVar26 = false;
                  if (_lowestValid < anchor && pBVar16 < pBStack_bb0) {
                    bVar26 = anchor[-1] == pBStack_bb0[-1];
                  }
                  if (!bVar26) break;
                  anchor = anchor + -1;
                  pBStack_bb0 = pBStack_bb0 + -1;
                  lStack_b18 = lStack_b18 + 1;
                }
                goto LAB_00125a06;
              }
            }
            sVar19 = ZSTD_count(anchor + 4,pBStack_b60 + 4,pBVar17);
            lStack_b18 = sVar19 + 4;
            h2._4_4_ = iVar10 - (int)pBStack_b60;
            while( true ) {
              bVar26 = false;
              if (_lowestValid < anchor && pBVar16 < pBStack_b60) {
                bVar26 = anchor[-1] == pBStack_b60[-1];
              }
              if (!bVar26) break;
              anchor = anchor + -1;
              pBStack_b60 = pBStack_b60 + -1;
              lStack_b18 = lStack_b18 + 1;
            }
            goto LAB_00125a06;
          }
        }
        anchor = anchor + ((long)anchor - (long)_lowestValid >> 8) + 1;
      }
      else {
        sVar19 = ZSTD_count(anchor + 5,anchor + (5 - (ulong)offsetSaved),pBVar17);
        lStack_b18 = sVar19 + 4;
        anchor = anchor + 1;
        uVar25 = (long)anchor - (long)_lowestValid;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 < _lowestValid + uVar25) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 + -0x20 < _lowestValid + uVar25) {
          ZSTD_safecopyLiterals(seqStore->lit,_lowestValid,_lowestValid + uVar25,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid);
          if (0x10 < uVar25) {
            pBVar7 = seqStore->lit;
            pBVar24 = pBVar7 + 0x10;
            lVar21 = (long)pBVar24 - (long)(_lowestValid + 0x10);
            if (lVar21 < 8 && -0x10 < lVar21) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar21 < 0x10 && -0x10 < lVar21) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar24,_lowestValid + 0x10);
            while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
              op_1 = _lowestValid + 0x20;
              ZSTD_copy16(pBVar7,op_1);
              ZSTD_copy16(pBVar7 + 0x10,_lowestValid + 0x30);
              _lowestValid = op_1;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar19 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar19 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_00125fd7:
        _lowestValid = anchor + lStack_b18;
        anchor = _lowestValid;
        if (_lowestValid <= pBVar18) {
          uVar11 = UVar13 + 2;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar1,8);
          pUVar4[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid + -2,UVar1,8);
          pUVar4[sVar19] = ((int)_lowestValid + -2) - iVar9;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar2,4);
          pUVar5[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid + -1,UVar2,4);
          pUVar5[sVar19] = ((int)_lowestValid + -1) - iVar9;
          while( true ) {
            uVar11 = local_ab0;
            bVar26 = false;
            if (anchor <= pBVar18) {
              UVar13 = MEM_read32(anchor);
              UVar15 = MEM_read32(anchor + -(ulong)local_ab0);
              bVar26 = local_ab0 != 0 && UVar13 == UVar15;
            }
            _lowestValid = anchor;
            if (!bVar26) break;
            sVar19 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)local_ab0),pBVar17);
            local_ab0 = offsetSaved;
            offsetSaved = uVar11;
            sVar20 = ZSTD_hashPtr(anchor,UVar2,4);
            pUVar5[sVar20] = (int)anchor - iVar9;
            sVar20 = ZSTD_hashPtr(anchor,UVar1,8);
            pUVar4[sVar20] = (int)anchor - iVar9;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 < anchor) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar19 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor = anchor + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved == 0) {
      local_1394 = dms._4_4_;
    }
    else {
      local_1394 = offsetSaved;
    }
    *rep = local_1394;
    if (local_ab0 == 0) {
      local_1398 = dms._4_4_;
    }
    else {
      local_1398 = local_ab0;
    }
    rep[1] = local_1398;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_lowestValid);
    break;
  case 5:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar9 = (int)pBVar6;
    iVar10 = (iVar8 - iVar9) + iVar10;
    local_139c = (ms->window).dictLimit;
    uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    if (uVar11 < iVar10 - local_139c) {
      local_139c = iVar10 - uVar11;
    }
    pBVar16 = pBVar6 + local_139c;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar11 = *rep;
    uVar3 = rep[1];
    dms_1._4_4_ = 0;
    anchor_1 = (BYTE *)((long)src + (long)(int)(uint)(iVar8 == (int)pBVar16));
    uVar12 = (int)anchor_1 - (int)pBVar16;
    local_ca8 = uVar3;
    if (uVar12 < uVar3) {
      local_ca8 = 0;
      dms_1._4_4_ = uVar3;
    }
    offsetSaved_1 = uVar11;
    _lowestValid_1 = (BYTE *)src;
    if (uVar12 < uVar11) {
      offsetSaved_1 = 0;
      dms_1._4_4_ = uVar11;
    }
    while (anchor_1 < pBVar18) {
      sVar19 = ZSTD_hashPtr(anchor_1,UVar1,8);
      sVar20 = ZSTD_hashPtr(anchor_1,UVar2,5);
      ZSTD_hashPtr(anchor_1,UVar1,8);
      ZSTD_hashPtr(anchor_1,UVar2,5);
      iVar10 = (int)anchor_1;
      UVar13 = iVar10 - iVar9;
      uVar11 = pUVar4[sVar19];
      uVar3 = pUVar5[sVar20];
      match_1 = pBVar6 + uVar11;
      pBStack_d58 = pBVar6 + uVar3;
      pUVar5[sVar20] = UVar13;
      pUVar4[sVar19] = UVar13;
      UVar15 = MEM_read32(anchor_1 + (1 - (ulong)offsetSaved_1));
      UVar14 = MEM_read32(anchor_1 + 1);
      if (offsetSaved_1 == 0 || UVar15 != UVar14) {
        if (local_139c < uVar11) {
          UVar22 = MEM_read64(match_1);
          UVar23 = MEM_read64(anchor_1);
          if (UVar22 != UVar23) goto LAB_001288b0;
          sVar19 = ZSTD_count(anchor_1 + 8,match_1 + 8,pBVar17);
          lStack_d10 = sVar19 + 8;
          h2_1._4_4_ = iVar10 - (int)match_1;
          while( true ) {
            bVar26 = false;
            if (_lowestValid_1 < anchor_1 && pBVar16 < match_1) {
              bVar26 = anchor_1[-1] == match_1[-1];
            }
            if (!bVar26) break;
            anchor_1 = anchor_1 + -1;
            match_1 = match_1 + -1;
            lStack_d10 = lStack_d10 + 1;
          }
LAB_00128f4a:
          local_ca8 = offsetSaved_1;
          offsetSaved_1 = h2_1._4_4_;
          uVar25 = (long)anchor_1 - (long)_lowestValid_1;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < _lowestValid_1 + uVar25) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < _lowestValid_1 + uVar25) {
            ZSTD_safecopyLiterals
                      (seqStore->lit,_lowestValid_1,_lowestValid_1 + uVar25,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_lowestValid_1);
            if (0x10 < uVar25) {
              pBVar7 = seqStore->lit;
              pBVar24 = pBVar7 + 0x10;
              lVar21 = (long)pBVar24 - (long)(_lowestValid_1 + 0x10);
              if (lVar21 < 8 && -0x10 < lVar21) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (lVar21 < 0x10 && -0x10 < lVar21) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar24,_lowestValid_1 + 0x10);
              while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
                op_7 = _lowestValid_1 + 0x20;
                ZSTD_copy16(pBVar7,op_7);
                ZSTD_copy16(pBVar7 + 0x10,_lowestValid_1 + 0x30);
                _lowestValid_1 = op_7;
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar25;
          seqStore->sequences->offset = h2_1._4_4_ + 3;
          if (0xffff < lStack_d10 - 3U) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_d10 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_0012951b;
        }
LAB_001288b0:
        if (local_139c < uVar3) {
          UVar15 = MEM_read32(pBStack_d58);
          UVar14 = MEM_read32(anchor_1);
          if (UVar15 == UVar14) {
            sVar19 = ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            ZSTD_hashPtr(anchor_1 + 1,UVar1,8);
            uVar11 = pUVar4[sVar19];
            pBStack_da8 = pBVar6 + uVar11;
            pUVar4[sVar19] = UVar13 + 1;
            if (local_139c < uVar11) {
              UVar22 = MEM_read64(pBStack_da8);
              UVar23 = MEM_read64(anchor_1 + 1);
              if (UVar22 == UVar23) {
                sVar19 = ZSTD_count(anchor_1 + 9,pBStack_da8 + 8,pBVar17);
                lStack_d10 = sVar19 + 8;
                anchor_1 = anchor_1 + 1;
                h2_1._4_4_ = (int)anchor_1 - (int)pBStack_da8;
                while( true ) {
                  bVar26 = false;
                  if (_lowestValid_1 < anchor_1 && pBVar16 < pBStack_da8) {
                    bVar26 = anchor_1[-1] == pBStack_da8[-1];
                  }
                  if (!bVar26) break;
                  anchor_1 = anchor_1 + -1;
                  pBStack_da8 = pBStack_da8 + -1;
                  lStack_d10 = lStack_d10 + 1;
                }
                goto LAB_00128f4a;
              }
            }
            sVar19 = ZSTD_count(anchor_1 + 4,pBStack_d58 + 4,pBVar17);
            lStack_d10 = sVar19 + 4;
            h2_1._4_4_ = iVar10 - (int)pBStack_d58;
            while( true ) {
              bVar26 = false;
              if (_lowestValid_1 < anchor_1 && pBVar16 < pBStack_d58) {
                bVar26 = anchor_1[-1] == pBStack_d58[-1];
              }
              if (!bVar26) break;
              anchor_1 = anchor_1 + -1;
              pBStack_d58 = pBStack_d58 + -1;
              lStack_d10 = lStack_d10 + 1;
            }
            goto LAB_00128f4a;
          }
        }
        anchor_1 = anchor_1 + ((long)anchor_1 - (long)_lowestValid_1 >> 8) + 1;
      }
      else {
        sVar19 = ZSTD_count(anchor_1 + 5,anchor_1 + (5 - (ulong)offsetSaved_1),pBVar17);
        lStack_d10 = sVar19 + 4;
        anchor_1 = anchor_1 + 1;
        uVar25 = (long)anchor_1 - (long)_lowestValid_1;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 < _lowestValid_1 + uVar25) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 + -0x20 < _lowestValid_1 + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_lowestValid_1,_lowestValid_1 + uVar25,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid_1);
          if (0x10 < uVar25) {
            pBVar7 = seqStore->lit;
            pBVar24 = pBVar7 + 0x10;
            lVar21 = (long)pBVar24 - (long)(_lowestValid_1 + 0x10);
            if (lVar21 < 8 && -0x10 < lVar21) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar21 < 0x10 && -0x10 < lVar21) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar24,_lowestValid_1 + 0x10);
            while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
              op_6 = _lowestValid_1 + 0x20;
              ZSTD_copy16(pBVar7,op_6);
              ZSTD_copy16(pBVar7 + 0x10,_lowestValid_1 + 0x30);
              _lowestValid_1 = op_6;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar19 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar19 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0012951b:
        _lowestValid_1 = anchor_1 + lStack_d10;
        anchor_1 = _lowestValid_1;
        if (_lowestValid_1 <= pBVar18) {
          uVar11 = UVar13 + 2;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar1,8);
          pUVar4[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid_1 + -2,UVar1,8);
          pUVar4[sVar19] = ((int)_lowestValid_1 + -2) - iVar9;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar2,5);
          pUVar5[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid_1 + -1,UVar2,5);
          pUVar5[sVar19] = ((int)_lowestValid_1 + -1) - iVar9;
          while( true ) {
            uVar11 = local_ca8;
            bVar26 = false;
            if (anchor_1 <= pBVar18) {
              UVar13 = MEM_read32(anchor_1);
              UVar15 = MEM_read32(anchor_1 + -(ulong)local_ca8);
              bVar26 = local_ca8 != 0 && UVar13 == UVar15;
            }
            _lowestValid_1 = anchor_1;
            if (!bVar26) break;
            sVar19 = ZSTD_count(anchor_1 + 4,anchor_1 + (4 - (ulong)local_ca8),pBVar17);
            local_ca8 = offsetSaved_1;
            offsetSaved_1 = uVar11;
            sVar20 = ZSTD_hashPtr(anchor_1,UVar2,5);
            pUVar5[sVar20] = (int)anchor_1 - iVar9;
            sVar20 = ZSTD_hashPtr(anchor_1,UVar1,8);
            pUVar4[sVar20] = (int)anchor_1 - iVar9;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 < anchor_1) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 + -0x20 < anchor_1) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_1,anchor_1,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_1);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar19 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor_1 = anchor_1 + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved_1 == 0) {
      local_1504 = dms_1._4_4_;
    }
    else {
      local_1504 = offsetSaved_1;
    }
    *rep = local_1504;
    if (local_ca8 == 0) {
      local_1508 = dms_1._4_4_;
    }
    else {
      local_1508 = local_ca8;
    }
    rep[1] = local_1508;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_lowestValid_1);
    break;
  case 6:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar9 = (int)pBVar6;
    iVar10 = (iVar8 - iVar9) + iVar10;
    local_150c = (ms->window).dictLimit;
    uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    if (uVar11 < iVar10 - local_150c) {
      local_150c = iVar10 - uVar11;
    }
    pBVar16 = pBVar6 + local_150c;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar11 = *rep;
    uVar3 = rep[1];
    dms_2._4_4_ = 0;
    anchor_2 = (BYTE *)((long)src + (long)(int)(uint)(iVar8 == (int)pBVar16));
    uVar12 = (int)anchor_2 - (int)pBVar16;
    local_ea0 = uVar3;
    if (uVar12 < uVar3) {
      local_ea0 = 0;
      dms_2._4_4_ = uVar3;
    }
    offsetSaved_2 = uVar11;
    _lowestValid_2 = (BYTE *)src;
    if (uVar12 < uVar11) {
      offsetSaved_2 = 0;
      dms_2._4_4_ = uVar11;
    }
    while (anchor_2 < pBVar18) {
      sVar19 = ZSTD_hashPtr(anchor_2,UVar1,8);
      sVar20 = ZSTD_hashPtr(anchor_2,UVar2,6);
      ZSTD_hashPtr(anchor_2,UVar1,8);
      ZSTD_hashPtr(anchor_2,UVar2,6);
      iVar10 = (int)anchor_2;
      UVar13 = iVar10 - iVar9;
      uVar11 = pUVar4[sVar19];
      uVar3 = pUVar5[sVar20];
      match_2 = pBVar6 + uVar11;
      pBStack_f50 = pBVar6 + uVar3;
      pUVar5[sVar20] = UVar13;
      pUVar4[sVar19] = UVar13;
      UVar15 = MEM_read32(anchor_2 + (1 - (ulong)offsetSaved_2));
      UVar14 = MEM_read32(anchor_2 + 1);
      if (offsetSaved_2 == 0 || UVar15 != UVar14) {
        if (local_150c < uVar11) {
          UVar22 = MEM_read64(match_2);
          UVar23 = MEM_read64(anchor_2);
          if (UVar22 != UVar23) goto LAB_0012bdf4;
          sVar19 = ZSTD_count(anchor_2 + 8,match_2 + 8,pBVar17);
          lStack_f08 = sVar19 + 8;
          h2_2._4_4_ = iVar10 - (int)match_2;
          while( true ) {
            bVar26 = false;
            if (_lowestValid_2 < anchor_2 && pBVar16 < match_2) {
              bVar26 = anchor_2[-1] == match_2[-1];
            }
            if (!bVar26) break;
            anchor_2 = anchor_2 + -1;
            match_2 = match_2 + -1;
            lStack_f08 = lStack_f08 + 1;
          }
LAB_0012c48e:
          local_ea0 = offsetSaved_2;
          offsetSaved_2 = h2_2._4_4_;
          uVar25 = (long)anchor_2 - (long)_lowestValid_2;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < _lowestValid_2 + uVar25) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < _lowestValid_2 + uVar25) {
            ZSTD_safecopyLiterals
                      (seqStore->lit,_lowestValid_2,_lowestValid_2 + uVar25,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_lowestValid_2);
            if (0x10 < uVar25) {
              pBVar7 = seqStore->lit;
              pBVar24 = pBVar7 + 0x10;
              lVar21 = (long)pBVar24 - (long)(_lowestValid_2 + 0x10);
              if (lVar21 < 8 && -0x10 < lVar21) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (lVar21 < 0x10 && -0x10 < lVar21) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar24,_lowestValid_2 + 0x10);
              while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
                op_12 = _lowestValid_2 + 0x20;
                ZSTD_copy16(pBVar7,op_12);
                ZSTD_copy16(pBVar7 + 0x10,_lowestValid_2 + 0x30);
                _lowestValid_2 = op_12;
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar25;
          seqStore->sequences->offset = h2_2._4_4_ + 3;
          if (0xffff < lStack_f08 - 3U) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_f08 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_0012ca5f;
        }
LAB_0012bdf4:
        if (local_150c < uVar3) {
          UVar15 = MEM_read32(pBStack_f50);
          UVar14 = MEM_read32(anchor_2);
          if (UVar15 == UVar14) {
            sVar19 = ZSTD_hashPtr(anchor_2 + 1,UVar1,8);
            ZSTD_hashPtr(anchor_2 + 1,UVar1,8);
            uVar11 = pUVar4[sVar19];
            pBStack_fa0 = pBVar6 + uVar11;
            pUVar4[sVar19] = UVar13 + 1;
            if (local_150c < uVar11) {
              UVar22 = MEM_read64(pBStack_fa0);
              UVar23 = MEM_read64(anchor_2 + 1);
              if (UVar22 == UVar23) {
                sVar19 = ZSTD_count(anchor_2 + 9,pBStack_fa0 + 8,pBVar17);
                lStack_f08 = sVar19 + 8;
                anchor_2 = anchor_2 + 1;
                h2_2._4_4_ = (int)anchor_2 - (int)pBStack_fa0;
                while( true ) {
                  bVar26 = false;
                  if (_lowestValid_2 < anchor_2 && pBVar16 < pBStack_fa0) {
                    bVar26 = anchor_2[-1] == pBStack_fa0[-1];
                  }
                  if (!bVar26) break;
                  anchor_2 = anchor_2 + -1;
                  pBStack_fa0 = pBStack_fa0 + -1;
                  lStack_f08 = lStack_f08 + 1;
                }
                goto LAB_0012c48e;
              }
            }
            sVar19 = ZSTD_count(anchor_2 + 4,pBStack_f50 + 4,pBVar17);
            lStack_f08 = sVar19 + 4;
            h2_2._4_4_ = iVar10 - (int)pBStack_f50;
            while( true ) {
              bVar26 = false;
              if (_lowestValid_2 < anchor_2 && pBVar16 < pBStack_f50) {
                bVar26 = anchor_2[-1] == pBStack_f50[-1];
              }
              if (!bVar26) break;
              anchor_2 = anchor_2 + -1;
              pBStack_f50 = pBStack_f50 + -1;
              lStack_f08 = lStack_f08 + 1;
            }
            goto LAB_0012c48e;
          }
        }
        anchor_2 = anchor_2 + ((long)anchor_2 - (long)_lowestValid_2 >> 8) + 1;
      }
      else {
        sVar19 = ZSTD_count(anchor_2 + 5,anchor_2 + (5 - (ulong)offsetSaved_2),pBVar17);
        lStack_f08 = sVar19 + 4;
        anchor_2 = anchor_2 + 1;
        uVar25 = (long)anchor_2 - (long)_lowestValid_2;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 < _lowestValid_2 + uVar25) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 + -0x20 < _lowestValid_2 + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_lowestValid_2,_lowestValid_2 + uVar25,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid_2);
          if (0x10 < uVar25) {
            pBVar7 = seqStore->lit;
            pBVar24 = pBVar7 + 0x10;
            lVar21 = (long)pBVar24 - (long)(_lowestValid_2 + 0x10);
            if (lVar21 < 8 && -0x10 < lVar21) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar21 < 0x10 && -0x10 < lVar21) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar24,_lowestValid_2 + 0x10);
            while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
              op_11 = _lowestValid_2 + 0x20;
              ZSTD_copy16(pBVar7,op_11);
              ZSTD_copy16(pBVar7 + 0x10,_lowestValid_2 + 0x30);
              _lowestValid_2 = op_11;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar19 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar19 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0012ca5f:
        _lowestValid_2 = anchor_2 + lStack_f08;
        anchor_2 = _lowestValid_2;
        if (_lowestValid_2 <= pBVar18) {
          uVar11 = UVar13 + 2;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar1,8);
          pUVar4[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid_2 + -2,UVar1,8);
          pUVar4[sVar19] = ((int)_lowestValid_2 + -2) - iVar9;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar2,6);
          pUVar5[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid_2 + -1,UVar2,6);
          pUVar5[sVar19] = ((int)_lowestValid_2 + -1) - iVar9;
          while( true ) {
            uVar11 = local_ea0;
            bVar26 = false;
            if (anchor_2 <= pBVar18) {
              UVar13 = MEM_read32(anchor_2);
              UVar15 = MEM_read32(anchor_2 + -(ulong)local_ea0);
              bVar26 = local_ea0 != 0 && UVar13 == UVar15;
            }
            _lowestValid_2 = anchor_2;
            if (!bVar26) break;
            sVar19 = ZSTD_count(anchor_2 + 4,anchor_2 + (4 - (ulong)local_ea0),pBVar17);
            local_ea0 = offsetSaved_2;
            offsetSaved_2 = uVar11;
            sVar20 = ZSTD_hashPtr(anchor_2,UVar2,6);
            pUVar5[sVar20] = (int)anchor_2 - iVar9;
            sVar20 = ZSTD_hashPtr(anchor_2,UVar1,8);
            pUVar4[sVar20] = (int)anchor_2 - iVar9;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 < anchor_2) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 + -0x20 < anchor_2) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_2,anchor_2,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_2);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar19 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor_2 = anchor_2 + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved_2 == 0) {
      local_1674 = dms_2._4_4_;
    }
    else {
      local_1674 = offsetSaved_2;
    }
    *rep = local_1674;
    if (local_ea0 == 0) {
      local_1678 = dms_2._4_4_;
    }
    else {
      local_1678 = local_ea0;
    }
    rep[1] = local_1678;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_lowestValid_2);
    break;
  case 7:
    pUVar4 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    pUVar5 = ms->chainTable;
    UVar2 = (ms->cParams).chainLog;
    pBVar6 = (ms->window).base;
    iVar9 = (int)pBVar6;
    iVar10 = (iVar8 - iVar9) + iVar10;
    local_167c = (ms->window).dictLimit;
    uVar11 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    if (uVar11 < iVar10 - local_167c) {
      local_167c = iVar10 - uVar11;
    }
    pBVar16 = pBVar6 + local_167c;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar11 = *rep;
    uVar3 = rep[1];
    dms_3._4_4_ = 0;
    anchor_3 = (BYTE *)((long)src + (long)(int)(uint)(iVar8 == (int)pBVar16));
    uVar12 = (int)anchor_3 - (int)pBVar16;
    local_1098 = uVar3;
    if (uVar12 < uVar3) {
      local_1098 = 0;
      dms_3._4_4_ = uVar3;
    }
    offsetSaved_3 = uVar11;
    _lowestValid_3 = (BYTE *)src;
    if (uVar12 < uVar11) {
      offsetSaved_3 = 0;
      dms_3._4_4_ = uVar11;
    }
    while (anchor_3 < pBVar18) {
      sVar19 = ZSTD_hashPtr(anchor_3,UVar1,8);
      sVar20 = ZSTD_hashPtr(anchor_3,UVar2,7);
      ZSTD_hashPtr(anchor_3,UVar1,8);
      ZSTD_hashPtr(anchor_3,UVar2,7);
      iVar10 = (int)anchor_3;
      UVar13 = iVar10 - iVar9;
      uVar11 = pUVar4[sVar19];
      uVar3 = pUVar5[sVar20];
      match_3 = pBVar6 + uVar11;
      pBStack_1148 = pBVar6 + uVar3;
      pUVar5[sVar20] = UVar13;
      pUVar4[sVar19] = UVar13;
      UVar15 = MEM_read32(anchor_3 + (1 - (ulong)offsetSaved_3));
      UVar14 = MEM_read32(anchor_3 + 1);
      if (offsetSaved_3 == 0 || UVar15 != UVar14) {
        if (local_167c < uVar11) {
          UVar22 = MEM_read64(match_3);
          UVar23 = MEM_read64(anchor_3);
          if (UVar22 != UVar23) goto LAB_0012f338;
          sVar19 = ZSTD_count(anchor_3 + 8,match_3 + 8,pBVar17);
          lStack_1100 = sVar19 + 8;
          h2_3._4_4_ = iVar10 - (int)match_3;
          while( true ) {
            bVar26 = false;
            if (_lowestValid_3 < anchor_3 && pBVar16 < match_3) {
              bVar26 = anchor_3[-1] == match_3[-1];
            }
            if (!bVar26) break;
            anchor_3 = anchor_3 + -1;
            match_3 = match_3 + -1;
            lStack_1100 = lStack_1100 + 1;
          }
LAB_0012f9d2:
          local_1098 = offsetSaved_3;
          offsetSaved_3 = h2_3._4_4_;
          uVar25 = (long)anchor_3 - (long)_lowestValid_3;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < _lowestValid_3 + uVar25) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < _lowestValid_3 + uVar25) {
            ZSTD_safecopyLiterals
                      (seqStore->lit,_lowestValid_3,_lowestValid_3 + uVar25,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,_lowestValid_3);
            if (0x10 < uVar25) {
              pBVar7 = seqStore->lit;
              pBVar24 = pBVar7 + 0x10;
              lVar21 = (long)pBVar24 - (long)(_lowestValid_3 + 0x10);
              if (lVar21 < 8 && -0x10 < lVar21) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if (lVar21 < 0x10 && -0x10 < lVar21) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar24,_lowestValid_3 + 0x10);
              while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
                op_17 = _lowestValid_3 + 0x20;
                ZSTD_copy16(pBVar7,op_17);
                ZSTD_copy16(pBVar7 + 0x10,_lowestValid_3 + 0x30);
                _lowestValid_3 = op_17;
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar25;
          seqStore->sequences->offset = h2_3._4_4_ + 3;
          if (0xffff < lStack_1100 - 3U) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(lStack_1100 - 3U);
          seqStore->sequences = seqStore->sequences + 1;
          goto LAB_0012ffa3;
        }
LAB_0012f338:
        if (local_167c < uVar3) {
          UVar15 = MEM_read32(pBStack_1148);
          UVar14 = MEM_read32(anchor_3);
          if (UVar15 == UVar14) {
            sVar19 = ZSTD_hashPtr(anchor_3 + 1,UVar1,8);
            ZSTD_hashPtr(anchor_3 + 1,UVar1,8);
            uVar11 = pUVar4[sVar19];
            pBStack_1198 = pBVar6 + uVar11;
            pUVar4[sVar19] = UVar13 + 1;
            if (local_167c < uVar11) {
              UVar22 = MEM_read64(pBStack_1198);
              UVar23 = MEM_read64(anchor_3 + 1);
              if (UVar22 == UVar23) {
                sVar19 = ZSTD_count(anchor_3 + 9,pBStack_1198 + 8,pBVar17);
                lStack_1100 = sVar19 + 8;
                anchor_3 = anchor_3 + 1;
                h2_3._4_4_ = (int)anchor_3 - (int)pBStack_1198;
                while( true ) {
                  bVar26 = false;
                  if (_lowestValid_3 < anchor_3 && pBVar16 < pBStack_1198) {
                    bVar26 = anchor_3[-1] == pBStack_1198[-1];
                  }
                  if (!bVar26) break;
                  anchor_3 = anchor_3 + -1;
                  pBStack_1198 = pBStack_1198 + -1;
                  lStack_1100 = lStack_1100 + 1;
                }
                goto LAB_0012f9d2;
              }
            }
            sVar19 = ZSTD_count(anchor_3 + 4,pBStack_1148 + 4,pBVar17);
            lStack_1100 = sVar19 + 4;
            h2_3._4_4_ = iVar10 - (int)pBStack_1148;
            while( true ) {
              bVar26 = false;
              if (_lowestValid_3 < anchor_3 && pBVar16 < pBStack_1148) {
                bVar26 = anchor_3[-1] == pBStack_1148[-1];
              }
              if (!bVar26) break;
              anchor_3 = anchor_3 + -1;
              pBStack_1148 = pBStack_1148 + -1;
              lStack_1100 = lStack_1100 + 1;
            }
            goto LAB_0012f9d2;
          }
        }
        anchor_3 = anchor_3 + ((long)anchor_3 - (long)_lowestValid_3 >> 8) + 1;
      }
      else {
        sVar19 = ZSTD_count(anchor_3 + 5,anchor_3 + (5 - (ulong)offsetSaved_3),pBVar17);
        lStack_1100 = sVar19 + 4;
        anchor_3 = anchor_3 + 1;
        uVar25 = (long)anchor_3 - (long)_lowestValid_3;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 < _lowestValid_3 + uVar25) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (pBVar17 + -0x20 < _lowestValid_3 + uVar25) {
          ZSTD_safecopyLiterals
                    (seqStore->lit,_lowestValid_3,_lowestValid_3 + uVar25,pBVar17 + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,_lowestValid_3);
          if (0x10 < uVar25) {
            pBVar7 = seqStore->lit;
            pBVar24 = pBVar7 + 0x10;
            lVar21 = (long)pBVar24 - (long)(_lowestValid_3 + 0x10);
            if (lVar21 < 8 && -0x10 < lVar21) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if (lVar21 < 0x10 && -0x10 < lVar21) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar24,_lowestValid_3 + 0x10);
            while (pBVar7 = pBVar7 + 0x20, pBVar7 < pBVar24 + (uVar25 - 0x10)) {
              op_16 = _lowestValid_3 + 0x20;
              ZSTD_copy16(pBVar7,op_16);
              ZSTD_copy16(pBVar7 + 0x10,_lowestValid_3 + 0x30);
              _lowestValid_3 = op_16;
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar25;
        if (0xffff < uVar25) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar25;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar19 + 1) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar19 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0012ffa3:
        _lowestValid_3 = anchor_3 + lStack_1100;
        anchor_3 = _lowestValid_3;
        if (_lowestValid_3 <= pBVar18) {
          uVar11 = UVar13 + 2;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar1,8);
          pUVar4[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid_3 + -2,UVar1,8);
          pUVar4[sVar19] = ((int)_lowestValid_3 + -2) - iVar9;
          sVar19 = ZSTD_hashPtr(pBVar6 + uVar11,UVar2,7);
          pUVar5[sVar19] = uVar11;
          sVar19 = ZSTD_hashPtr(_lowestValid_3 + -1,UVar2,7);
          pUVar5[sVar19] = ((int)_lowestValid_3 + -1) - iVar9;
          while( true ) {
            uVar11 = local_1098;
            bVar26 = false;
            if (anchor_3 <= pBVar18) {
              UVar13 = MEM_read32(anchor_3);
              UVar15 = MEM_read32(anchor_3 + -(ulong)local_1098);
              bVar26 = local_1098 != 0 && UVar13 == UVar15;
            }
            _lowestValid_3 = anchor_3;
            if (!bVar26) break;
            sVar19 = ZSTD_count(anchor_3 + 4,anchor_3 + (4 - (ulong)local_1098),pBVar17);
            local_1098 = offsetSaved_3;
            offsetSaved_3 = uVar11;
            sVar20 = ZSTD_hashPtr(anchor_3,UVar2,7);
            pUVar5[sVar20] = (int)anchor_3 - iVar9;
            sVar20 = ZSTD_hashPtr(anchor_3,UVar1,8);
            pUVar4[sVar20] = (int)anchor_3 - iVar9;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2038,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203a,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 < anchor_3) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203c,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (pBVar17 + -0x20 < anchor_3) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor_3,anchor_3,pBVar17 + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor_3);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) {
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2058,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->matchLength = (U16)(sVar19 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            anchor_3 = anchor_3 + sVar19 + 4;
          }
        }
      }
    }
    if (offsetSaved_3 == 0) {
      local_17e4 = dms_3._4_4_;
    }
    else {
      local_17e4 = offsetSaved_3;
    }
    *rep = local_17e4;
    if (local_1098 == 0) {
      local_17e8 = dms_3._4_4_;
    }
    else {
      local_17e8 = local_1098;
    }
    rep[1] = local_17e8;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_lowestValid_3);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}